

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readSIB(InternalInstruction *insn)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  byte local_21;
  int local_20;
  uint8_t base;
  int iStack_1c;
  uint8_t index;
  SIBBase sibBaseBase;
  SIBIndex sibIndexBase;
  InternalInstruction *insn_local;
  
  iStack_1c = 0;
  local_20 = 0;
  if ((insn->consumedSIB & 1U) == 0) {
    insn->consumedSIB = true;
    uVar2 = insn->addressSize;
    if (uVar2 == '\x02') {
      insn_local._4_4_ = -1;
    }
    else {
      if (uVar2 == '\x04') {
        iStack_1c = 0x11;
        local_20 = 1;
      }
      else if (uVar2 == '\b') {
        iStack_1c = 0x21;
        local_20 = 0x11;
      }
      iVar3 = consumeByte(insn,&insn->sib);
      if (iVar3 == 0) {
        local_21 = (byte)((int)(insn->sib & 0x38) >> 3) |
                   (byte)(((int)(insn->rexPrefix & 2) >> 1) << 3);
        if (insn->vectorExtensionType == TYPE_EVEX) {
          local_21 = local_21 |
                     (byte)(((int)((insn->vectorExtensionPrefix[3] ^ 0xffffffff) & 8) >> 3) << 4);
        }
        if (local_21 == 4) {
          insn->sibIndex = SIB_INDEX_NONE;
        }
        else {
          insn->sibIndex = iStack_1c + (uint)local_21;
          if ((insn->sibIndex == SIB_INDEX_sib) || (insn->sibIndex == SIB_INDEX_sib64)) {
            insn->sibIndex = SIB_INDEX_NONE;
          }
        }
        switch(insn->sib >> 6) {
        case '\0':
          insn->sibScale = '\x01';
          break;
        case '\x01':
          insn->sibScale = '\x02';
          break;
        case '\x02':
          insn->sibScale = '\x04';
          break;
        case '\x03':
          insn->sibScale = '\b';
        }
        bVar1 = (insn->sib & 7) + (insn->rexPrefix & 1) * '\b';
        if ((bVar1 | 8) == 0xd) {
          switch(insn->modRM >> 6) {
          case '\0':
            insn->eaDisplacement = EA_DISP_32;
            insn->sibBase = SIB_BASE_NONE;
            break;
          case '\x01':
            insn->eaDisplacement = EA_DISP_8;
            insn->sibBase = local_20 + (uint)bVar1;
            break;
          case '\x02':
            insn->eaDisplacement = EA_DISP_32;
            insn->sibBase = local_20 + (uint)bVar1;
            break;
          case '\x03':
            return -1;
          }
        }
        else {
          insn->sibBase = local_20 + (uint)bVar1;
        }
        insn_local._4_4_ = 0;
      }
      else {
        insn_local._4_4_ = -1;
      }
    }
  }
  else {
    insn_local._4_4_ = 0;
  }
  return insn_local._4_4_;
}

Assistant:

static int readSIB(struct InternalInstruction *insn)
{
	SIBIndex sibIndexBase = SIB_INDEX_NONE;
	SIBBase sibBaseBase = SIB_BASE_NONE;
	uint8_t index, base;

	// dbgprintf(insn, "readSIB()");

	if (insn->consumedSIB)
		return 0;

	insn->consumedSIB = true;

	switch (insn->addressSize) {
		case 2:
			// dbgprintf(insn, "SIB-based addressing doesn't work in 16-bit mode");
			return -1;
		case 4:
			sibIndexBase = SIB_INDEX_EAX;
			sibBaseBase = SIB_BASE_EAX;
			break;
		case 8:
			sibIndexBase = SIB_INDEX_RAX;
			sibBaseBase = SIB_BASE_RAX;
			break;
	}

	if (consumeByte(insn, &insn->sib))
		return -1;

	index = indexFromSIB(insn->sib) | (xFromREX(insn->rexPrefix) << 3);
	if (insn->vectorExtensionType == TYPE_EVEX)
		index |= v2FromEVEX4of4(insn->vectorExtensionPrefix[3]) << 4;

	switch (index) {
		case 0x4:
			insn->sibIndex = SIB_INDEX_NONE;
			break;
		default:
			insn->sibIndex = (SIBIndex)(sibIndexBase + index);
			if (insn->sibIndex == SIB_INDEX_sib ||
					insn->sibIndex == SIB_INDEX_sib64)
				insn->sibIndex = SIB_INDEX_NONE;
			break;
	}

	switch (scaleFromSIB(insn->sib)) {
		case 0:
			insn->sibScale = 1;
			break;
		case 1:
			insn->sibScale = 2;
			break;
		case 2:
			insn->sibScale = 4;
			break;
		case 3:
			insn->sibScale = 8;
			break;
	}

	base = baseFromSIB(insn->sib) | (bFromREX(insn->rexPrefix) << 3);

	switch (base) {
		case 0x5:
		case 0xd:
			switch (modFromModRM(insn->modRM)) {
				case 0x0:
					insn->eaDisplacement = EA_DISP_32;
					insn->sibBase = SIB_BASE_NONE;
					break;
				case 0x1:
					insn->eaDisplacement = EA_DISP_8;
					insn->sibBase = (SIBBase)(sibBaseBase + base);
					break;
				case 0x2:
					insn->eaDisplacement = EA_DISP_32;
					insn->sibBase = (SIBBase)(sibBaseBase + base);
					break;
				case 0x3:
					//debug("Cannot have Mod = 0b11 and a SIB byte");
					return -1;
			}
			break;
		default:
			insn->sibBase = (SIBBase)(sibBaseBase + base);
			break;
	}

	return 0;
}